

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Dgemm64_c(char ta,char tb,int64_t m,int64_t n,int64_t k,double alpha,int g_a,int g_b,
                 double beta,int g_c)

{
  Integer cjhi;
  Integer cjlo;
  Integer cihi;
  Integer cilo;
  Integer bjhi;
  Integer bjlo;
  Integer bihi;
  Integer bilo;
  Integer ajhi;
  Integer ajlo;
  Integer aihi;
  Integer ailo;
  Integer G_c;
  Integer G_b;
  Integer G_a;
  Integer in_stack_00000298;
  Integer in_stack_000002a0;
  void *in_stack_000002a8;
  void *in_stack_000002b0;
  char *in_stack_000002b8;
  char *in_stack_000002c0;
  Integer in_stack_00000300;
  Integer in_stack_00000308;
  Integer in_stack_00000310;
  Integer in_stack_00000318;
  Integer in_stack_00000320;
  Integer in_stack_00000328;
  Integer in_stack_00000330;
  Integer in_stack_00000338;
  Integer in_stack_00000340;
  Integer in_stack_00000348;
  Integer in_stack_00000350;
  Integer in_stack_00000358;
  Integer in_stack_00000360;
  
  pnga_matmul(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0,in_stack_000002a8,
              in_stack_000002a0,in_stack_00000298,in_stack_00000300,in_stack_00000308,
              in_stack_00000310,in_stack_00000318,in_stack_00000320,in_stack_00000328,
              in_stack_00000330,in_stack_00000338,in_stack_00000340,in_stack_00000348,
              in_stack_00000350,in_stack_00000358,in_stack_00000360);
  return;
}

Assistant:

void GA_Dgemm64_c(char ta, char tb, int64_t m, int64_t n, int64_t k,
                double alpha, int g_a, int g_b, double beta, int g_c )
{
  Integer G_a = g_a;
  Integer G_b = g_b;
  Integer G_c = g_c;

  Integer ailo = 1;
  Integer aihi = m;
  Integer ajlo = 1;
  Integer ajhi = k;
  
  Integer bilo = 1;
  Integer bihi = k;
  Integer bjlo = 1;
  Integer bjhi = n;
  
  Integer cilo = 1;
  Integer cihi = m;
  Integer cjlo = 1;
  Integer cjhi = n;
  
  pnga_matmul(&ta, &tb, (DoublePrecision *)&alpha,(DoublePrecision *)&beta,
	    G_a, ailo, aihi, ajlo, ajhi,
	    G_b, bilo, bihi, bjlo, bjhi,
	    G_c, cilo, cihi, cjlo, cjhi);
}